

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  bool bVar1;
  iterator __pos;
  CZString key;
  value_type defaultValue;
  
  if (*(char *)&this->bits_ == '\0') {
    Value((Value *)&defaultValue,arrayValue);
    swap((Value *)&defaultValue,this);
    ~Value((Value *)&defaultValue);
  }
  else if (*(char *)&this->bits_ != '\x06') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&defaultValue);
    std::operator<<((ostream *)&defaultValue,
                    "in Json::Value::operator[](ArrayIndex): requires arrayValue");
    std::__cxx11::stringbuf::str();
    throwLogicError((String *)&key);
  }
  key.cstr_ = (char *)0x0;
  key.field_1.index_ = index;
  __pos = std::
          _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
          ::lower_bound(&((this->value_).map_)->_M_t,&key);
  if ((_Rb_tree_header *)__pos._M_node !=
      &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
    bVar1 = CZString::operator==((CZString *)(__pos._M_node + 1),&key);
    if (bVar1) goto LAB_0010e62d;
  }
  nullSingleton();
  std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
            (&defaultValue,&key,&nullSingleton::nullStatic);
  __pos = std::
          _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                    ((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                      *)(this->value_).map_,__pos._M_node,&defaultValue);
  std::pair<const_Json::Value::CZString,_Json::Value>::~pair(&defaultValue);
LAB_0010e62d:
  CZString::~CZString(&key);
  return (Value *)&__pos._M_node[1]._M_left;
}

Assistant:

Value& Value::operator[](ArrayIndex index) {
  JSON_ASSERT_MESSAGE(
      type() == nullValue || type() == arrayValue,
      "in Json::Value::operator[](ArrayIndex): requires arrayValue");
  if (type() == nullValue)
    *this = Value(arrayValue);
  CZString key(index);
  auto it = value_.map_->lower_bound(key);
  if (it != value_.map_->end() && (*it).first == key)
    return (*it).second;

  ObjectValues::value_type defaultValue(key, nullSingleton());
  it = value_.map_->insert(it, defaultValue);
  return (*it).second;
}